

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  char *pcVar1;
  StringPiece *pSVar2;
  Prog *pPVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint __c;
  long lVar7;
  uint32 *__s;
  char **__s_00;
  Job *pJVar8;
  byte *p0;
  long lVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  byte *pbVar14;
  size_t __n;
  
  (this->text_).length_ = text->length_;
  (this->text_).ptr_ = text->ptr_;
  pcVar1 = context->ptr_;
  (this->context_).ptr_ = pcVar1;
  (this->context_).length_ = context->length_;
  if (pcVar1 == (char *)0x0) {
    (this->context_).length_ = text->length_;
    (this->context_).ptr_ = text->ptr_;
  }
  bVar4 = this->prog_->anchor_start_;
  if (((bVar4 == true) && ((this->context_).ptr_ != text->ptr_)) ||
     ((bVar5 = this->prog_->anchor_end_, bVar5 == true &&
      ((this->context_).ptr_ + (this->context_).length_ != text->ptr_ + text->length_)))) {
    bVar4 = false;
  }
  else {
    if (anchored) {
      bVar4 = true;
    }
    this->anchored_ = bVar4;
    bVar10 = bVar5;
    if (longest) {
      bVar10 = true;
    }
    this->longest_ = bVar10;
    this->endmatch_ = bVar5;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (0 < nsubmatch) {
      lVar7 = 8;
      lVar9 = 0;
      do {
        pSVar2 = this->submatch_;
        *(undefined8 *)((long)pSVar2 + lVar7 + -8) = 0;
        *(undefined4 *)((long)&pSVar2->ptr_ + lVar7) = 0;
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar9 < this->nsubmatch_);
    }
    pPVar3 = this->prog_;
    iVar6 = (text->length_ + 1) * pPVar3->size_;
    iVar11 = iVar6 + 0x3e;
    if (-1 < iVar6 + 0x1f) {
      iVar11 = iVar6 + 0x1f;
    }
    this->nvisited_ = iVar11 >> 5;
    __n = (long)(iVar11 >> 5) << 2;
    sVar12 = __n;
    if (iVar6 < -0x3e) {
      sVar12 = 0xffffffffffffffff;
    }
    __s = (uint32 *)operator_new__(sVar12);
    this->visited_ = __s;
    memset(__s,0,__n);
    iVar11 = 2;
    if (0 < nsubmatch) {
      iVar11 = nsubmatch * 2;
    }
    this->ncap_ = iVar11;
    uVar13 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar13 = (long)iVar11 * 8;
    }
    __s_00 = (char **)operator_new__(uVar13);
    this->cap_ = __s_00;
    memset(__s_00,0,(long)iVar11 * 8);
    this->maxjob_ = 0x100;
    pJVar8 = (Job *)operator_new__(0x1000);
    this->job_ = pJVar8;
    if (bVar4 != false) {
      pcVar1 = text->ptr_;
      *__s_00 = pcVar1;
      bVar4 = TrySearch(this,pPVar3->start_,pcVar1);
      return bVar4;
    }
    bVar4 = -1 < text->length_;
    if (bVar4) {
      p0 = (byte *)text->ptr_;
      do {
        __c = Prog::first_byte(this->prog_);
        if ((((-1 < (int)__c) && (pbVar14 = (byte *)(text->ptr_ + text->length_), p0 < pbVar14)) &&
            (__c != *p0)) &&
           (p0 = (byte *)memchr(p0,__c,(long)pbVar14 - (long)p0), p0 == (byte *)0x0)) {
          p0 = pbVar14;
        }
        *this->cap_ = (char *)p0;
        bVar5 = TrySearch(this,this->prog_->start_,(char *)p0);
        if (bVar5) {
          return bVar4;
        }
        p0 = p0 + 1;
        bVar4 = p0 <= text->ptr_ + text->length_;
      } while (p0 <= text->ptr_ + text->length_);
    }
  }
  return bVar4;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = NULL;

  // Allocate scratch space.
  nvisited_ = (prog_->size() * (text.size()+1) + VisitedBits-1) / VisitedBits;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);
  // VLOG(0) << "nvisited_ = " << nvisited_;

  ncap_ = 2*nsubmatch;
  if (ncap_ < 2)
    ncap_ = 2;
  cap_ = new const char*[ncap_];
  memset(cap_, 0, ncap_*sizeof cap_[0]);

  maxjob_ = 256;
  job_ = new Job[maxjob_];

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return TrySearch(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.begin(); p <= text.end(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
      if (p == NULL)
        p = text.end();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}